

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ZSTD_longLengthType_e ZVar4;
  seqDef *psVar5;
  seqDef *psVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ZSTD_Sequence *pZVar20;
  undefined8 local_60;
  uint local_58;
  ZSTD_Sequence *local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_38 = (zc->seqCollector).seqIndex;
  uVar11 = (zc->seqCollector).maxSequences;
  if (uVar11 <= local_38 + 1) {
    __assert_fail("zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5db1,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  psVar5 = (zc->seqStore).sequencesStart;
  psVar6 = (zc->seqStore).sequences;
  lVar10 = (long)psVar6 - (long)psVar5 >> 3;
  local_40 = lVar10 + 1;
  if (uVar11 < local_40) {
    __assert_fail("zc->seqCollector.maxSequences >= seqStoreSeqSize + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5db3,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  local_48 = (long)(zc->seqStore).lit - (long)(zc->seqStore).litStart;
  local_50 = (zc->seqCollector).seqStart + local_38;
  pZVar7 = (zc->blockState).prevCBlock;
  uVar17 = pZVar7->rep[2];
  local_58 = uVar17;
  local_60 = *(undefined8 *)pZVar7->rep;
  uVar8 = local_60;
  if (psVar6 == psVar5) {
    uVar11 = 0;
    uVar15 = 0;
  }
  else {
    local_60._4_4_ = (uint)((ulong)local_60 >> 0x20);
    uVar3 = (zc->seqStore).longLengthPos;
    uVar11 = lVar10 + (ulong)(lVar10 == 0);
    uVar19 = 0;
    uVar15 = 0;
    pZVar20 = local_50;
    uVar16 = (uint)local_60;
    uVar14 = local_60._4_4_;
    local_60 = uVar8;
    do {
      uVar12 = psVar5[uVar19].offBase;
      uVar1 = psVar5[uVar19].litLength;
      uVar9 = (uint)uVar1;
      pZVar20->litLength = (uint)uVar1;
      uVar2 = psVar5[uVar19].mlBase;
      pZVar20->matchLength = uVar2 + 3;
      pZVar20->rep = 0;
      uVar18 = (uint)uVar1;
      if (uVar3 == uVar19) {
        ZVar4 = (zc->seqStore).longLengthType;
        uVar18 = uVar9;
        if (ZVar4 == ZSTD_llt_matchLength) {
          pZVar20->matchLength = uVar2 + 0x10003;
        }
        else if (ZVar4 == ZSTD_llt_literalLength) {
          pZVar20->litLength = uVar9 + 0x10000;
          uVar18 = uVar9 + 0x10000;
        }
      }
      if (uVar12 < 4) {
        pZVar20->rep = uVar12;
        if (uVar18 == 0) {
          uVar13 = uVar12;
          if (uVar12 != 3) goto LAB_00194b7d;
          pZVar20->offset = uVar16 - 1;
        }
        else {
          uVar13 = uVar12 - 1;
LAB_00194b7d:
          pZVar20->offset = *(uint *)((long)&local_60 + (ulong)uVar13 * 4);
          if (uVar12 == 0) {
            __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
          }
        }
        uVar13 = (uVar12 + (uVar9 == 0)) - 1;
        uVar12 = uVar16;
        uVar9 = uVar14;
        if (uVar13 != 0) {
          if (uVar13 == 3) {
            uVar12 = uVar16 - 1;
          }
          else {
            uVar12 = *(uint *)((long)&local_60 + (ulong)uVar13 * 4);
          }
          if (uVar13 == 1) {
            uVar14 = uVar17;
          }
          goto LAB_00194bb0;
        }
      }
      else {
        uVar12 = uVar12 - 3;
        pZVar20->offset = uVar12;
LAB_00194bb0:
        local_58 = uVar14;
        local_60 = CONCAT44(uVar16,uVar12);
        uVar9 = uVar16;
        uVar17 = uVar14;
      }
      uVar14 = uVar9;
      uVar16 = uVar12;
      uVar15 = uVar15 + uVar18;
      uVar19 = uVar19 + 1;
      pZVar20 = pZVar20 + 1;
    } while (uVar11 != uVar19);
    if (local_48 < uVar15) {
      __assert_fail("seqStoreLiteralsSize >= literalsRead",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5ddc,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
    }
  }
  local_50[uVar11].litLength = (int)local_48 - (int)uVar15;
  local_50[uVar11].offset = 0;
  local_50[uVar11].matchLength = 0;
  local_50[uVar11].rep = 0;
  (zc->seqCollector).seqIndex = local_38 + local_40;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offBase - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offBase <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offBase;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        ZSTD_updateRep(updatedRepcodes.rep,
                       seqStoreSeqs[i].offBase,
                       seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}